

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 computeNumericType(Mem *pMem)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int rc;
  sqlite3_int64 ix;
  i64 *in_stack_00000020;
  char *in_stack_00000028;
  u8 in_stack_00000053;
  int in_stack_00000054;
  double *in_stack_00000058;
  char *in_stack_00000060;
  undefined2 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffda;
  u16 local_12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(ushort *)((long)in_RDI + 0x14) & 0x400) == 0) ||
     (iVar2 = sqlite3VdbeMemExpandBlob
                        ((Mem *)CONCAT44(0xaaaaaaaa,
                                         CONCAT22(in_stack_ffffffffffffffda,
                                                  in_stack_ffffffffffffffd8))), iVar2 == 0)) {
    iVar2 = sqlite3AtoF(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000053);
    if (iVar2 < 1) {
      if ((iVar2 == 0) &&
         (iVar2 = sqlite3Atoi64(in_stack_00000028,in_stack_00000020,ix._4_4_,ix._3_1_), iVar2 < 2))
      {
        *in_RDI = &DAT_aaaaaaaaaaaaaaaa;
        local_12 = 4;
      }
      else {
        local_12 = 8;
      }
    }
    else if ((iVar2 == 1) &&
            (iVar2 = sqlite3Atoi64(in_stack_00000028,in_stack_00000020,ix._4_4_,ix._3_1_),
            iVar2 == 0)) {
      *in_RDI = &DAT_aaaaaaaaaaaaaaaa;
      local_12 = 4;
    }
    else {
      local_12 = 8;
    }
  }
  else {
    *in_RDI = 0;
    local_12 = 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_12;
  }
  __stack_chk_fail();
}

Assistant:

static u16 SQLITE_NOINLINE computeNumericType(Mem *pMem){
  int rc;
  sqlite3_int64 ix;
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal))==0 );
  assert( (pMem->flags & (MEM_Str|MEM_Blob))!=0 );
  if( ExpandBlob(pMem) ){
    pMem->u.i = 0;
    return MEM_Int;
  }
  rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
  if( rc<=0 ){
    if( rc==0 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1 ){
      pMem->u.i = ix;
      return MEM_Int;
    }else{
      return MEM_Real;
    }
  }else if( rc==1 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)==0 ){
    pMem->u.i = ix;
    return MEM_Int;
  }
  return MEM_Real;
}